

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall unitOps_root_Test::TestBody(unitOps_root_Test *this)

{
  unit_data uVar1;
  unit_data extraout_EAX;
  unit_data extraout_EAX_00;
  unit_data extraout_EAX_01;
  unit_data extraout_EAX_02;
  unit_data extraout_EAX_03;
  unit_data extraout_EAX_04;
  long extraout_RAX;
  long extraout_RAX_00;
  char *pcVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  double extraout_XMM0_Qa_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  double in_XMM1_Qa;
  AssertionResult gtest_ar;
  unit ft1;
  unit m1;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  unit local_68;
  unit local_60;
  unit local_58;
  float local_4c;
  unit local_48;
  unit local_40;
  unit local_38;
  unit local_30;
  unit local_28;
  unit local_20;
  unit local_18;
  
  local_18 = units::root((unit *)&units::m,0);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"root(m, 0)","one",&local_18,(unit *)&units::one);
  dVar3 = extraout_XMM0_Qa;
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_18);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_28,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_28);
    dVar3 = extraout_XMM0_Qa_00;
    if (local_18 != (unit)0x0) {
      dVar3 = (double)(**(code **)(*(long *)local_18 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
    dVar3 = extraout_XMM0_Qa_01;
  }
  units::detail::unit_data::pow((unit_data *)((long)&units::m + 4),dVar3,in_XMM1_Qa);
  local_18 = (unit)(extraout_RAX << 0x20 | 0x3f800000);
  local_28 = units::root(&local_18,1);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"m","root(m1, 1)",(unit *)&units::m,&local_28);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_28 != (unit)0x0) {
      (**(code **)(*(long *)local_28 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  uVar1 = units::detail::unit_data::inv((unit_data *)((long)&units::m + 4));
  local_28 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x3f800000);
  local_38 = units::root(&local_18,-1);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"m.inv()","root(m1, -1)",&local_28,&local_38);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_28 != (unit)0x0) {
      (**(code **)(*(long *)local_28 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_4c = units::detail::power_const<float>(1.0,2);
  units::detail::unit_data::pow
            ((unit_data *)((long)&units::m + 4),(double)CONCAT44(extraout_XMM0_Db,local_4c),
             in_XMM1_Qa);
  local_28.base_units_ = extraout_EAX;
  local_28.multiplier_ = local_4c;
  local_38 = units::root(&local_28,2);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"m","root(m2, 2)",(unit *)&units::m,&local_38);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    if (local_38 != (unit)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_38 = units::root(&local_28,2);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"m","sqrt(m2)",(unit *)&units::m,&local_38);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    if (local_38 != (unit)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_4c = units::detail::power_const<float>(1.0,4);
  units::detail::unit_data::pow
            ((unit_data *)((long)&units::m + 4),(double)CONCAT44(extraout_XMM0_Db_00,local_4c),
             in_XMM1_Qa);
  local_38.base_units_ = extraout_EAX_00;
  local_38.multiplier_ = local_4c;
  uVar1 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::m + 4),(unit_data *)((long)&units::m + 4));
  local_30 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x3f800000);
  local_40 = units::root(&local_38,2);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"m * m","root(m4, 2)",&local_30,&local_40);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30 != (unit)0x0) {
      (**(code **)(*(long *)local_30 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_30 = units::root(&local_38,4);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"m","root(m4, 4)",(unit *)&units::m,&local_30);
  dVar3 = extraout_XMM0_Qa_02;
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    dVar3 = extraout_XMM0_Qa_03;
    if (local_30 != (unit)0x0) {
      dVar3 = (double)(**(code **)(*(long *)local_30 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
    dVar3 = extraout_XMM0_Qa_04;
  }
  units::detail::unit_data::pow((unit_data *)((long)&units::ft + 4),dVar3,in_XMM1_Qa);
  local_30 = (unit)(extraout_RAX_00 << 0x20 | 0x3e9c0ebf);
  local_40 = units::root(&local_30,1);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"ft","root(ft1, 1)",(unit *)&units::ft,&local_40);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_40 != (unit)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  uVar1 = units::detail::unit_data::inv((unit_data *)((long)&units::ft + 4));
  local_40 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x4051f948);
  local_48 = units::root(&local_30,-1);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"ft.inv()","root(ft1, -1)",&local_40,&local_48);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_40 != (unit)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_4c = units::detail::power_const<float>(0.3048,2);
  units::detail::unit_data::pow
            ((unit_data *)((long)&units::ft + 4),(double)CONCAT44(extraout_XMM0_Db_01,local_4c),
             in_XMM1_Qa);
  local_40.base_units_ = extraout_EAX_01;
  local_40.multiplier_ = local_4c;
  local_48 = units::root(&local_40,2);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"ft","root(ft2, 2)",(unit *)&units::ft,&local_48);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48 != (unit)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  uVar1 = units::detail::unit_data::inv((unit_data *)((long)&units::ft + 4));
  local_48 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x4051f948);
  local_58 = units::root(&local_40,-2);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"ft.inv()","root(ft2, -2)",&local_48,&local_58);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48 != (unit)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_4c = units::detail::power_const<float>(0.3048,3);
  units::detail::unit_data::pow
            ((unit_data *)((long)&units::ft + 4),(double)CONCAT44(extraout_XMM0_Db_02,local_4c),
             in_XMM1_Qa);
  local_48.base_units_ = extraout_EAX_02;
  local_48.multiplier_ = local_4c;
  local_58 = units::root(&local_48,3);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"ft","root(ft3, 3)",(unit *)&units::ft,&local_58);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (local_58 != (unit)0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  uVar1 = units::detail::unit_data::inv((unit_data *)((long)&units::ft + 4));
  local_58 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x4051f948);
  local_60 = units::root(&local_48,-3);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"ft.inv()","root(ft3, -3)",&local_58,&local_60);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (local_58 != (unit)0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_4c = units::detail::power_const<float>(0.3048,4);
  units::detail::unit_data::pow
            ((unit_data *)((long)&units::ft + 4),(double)CONCAT44(extraout_XMM0_Db_03,local_4c),
             in_XMM1_Qa);
  local_58.base_units_ = extraout_EAX_03;
  local_58.multiplier_ = local_4c;
  uVar1 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::ft + 4),(unit_data *)((long)&units::ft + 4));
  local_60 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x3dbe43f3);
  local_68 = units::root(&local_58,2);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"ft * ft","root(ft4, 2)",&local_60,&local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_60 != (unit)0x0) {
      (**(code **)(*(long *)local_60 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_60 = units::root(&local_58,4);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"ft","root(ft4, 4)",(unit *)&units::ft,&local_60);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_60 != (unit)0x0) {
      (**(code **)(*(long *)local_60 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  uVar1 = units::detail::unit_data::inv((unit_data *)((long)&units::ft + 4));
  local_60 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x4051f948);
  local_68 = units::root(&local_58,-4);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"ft.inv()","root(ft4, -4)",&local_60,&local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_60 != (unit)0x0) {
      (**(code **)(*(long *)local_60 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_4c = units::detail::power_const<float>(0.3048,5);
  units::detail::unit_data::pow
            ((unit_data *)((long)&units::ft + 4),(double)CONCAT44(extraout_XMM0_Db_04,local_4c),
             in_XMM1_Qa);
  local_60.base_units_ = extraout_EAX_04;
  local_60.multiplier_ = local_4c;
  local_68 = units::root(&local_60,5);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"ft","root(ft5, 5)",(unit *)&units::ft,&local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if (local_68 != (unit)0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  uVar1 = units::detail::unit_data::inv((unit_data *)((long)&units::ft + 4));
  local_68 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x4051f948);
  local_20 = units::root(&local_60,-5);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"ft.inv()","root(ft5, -5)",&local_68,&local_20);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if (local_68 != (unit)0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_20.multiplier_ = -4.5;
  local_20.base_units_ = (unit_data)0x1;
  local_68 = units::root(&local_20,2);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_78,"root(unit(-4.5, m), 2)","error",&local_68,(unit *)&units::error);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if (local_68 != (unit)0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST(unitOps, root)
{
    EXPECT_EQ(root(m, 0), one);
    auto m1 = m.pow(1);
    EXPECT_EQ(m, root(m1, 1));
    EXPECT_EQ(m.inv(), root(m1, -1));
    auto m2 = pow(m, 2);
    EXPECT_EQ(m, root(m2, 2));

    EXPECT_EQ(m, sqrt(m2));

    auto m4 = m.pow(4);
    EXPECT_EQ(m * m, root(m4, 2));
    EXPECT_EQ(m, root(m4, 4));

    auto ft1 = ft.pow(1);
    EXPECT_EQ(ft, root(ft1, 1));
    EXPECT_EQ(ft.inv(), root(ft1, -1));

    auto ft2 = ft.pow(2);
    EXPECT_EQ(ft, root(ft2, 2));
    EXPECT_EQ(ft.inv(), root(ft2, -2));
    auto ft3 = ft.pow(3);
    EXPECT_EQ(ft, root(ft3, 3));
    EXPECT_EQ(ft.inv(), root(ft3, -3));
    auto ft4 = ft.pow(4);
    EXPECT_EQ(ft * ft, root(ft4, 2));
    EXPECT_EQ(ft, root(ft4, 4));
    EXPECT_EQ(ft.inv(), root(ft4, -4));

    auto ft5 = ft.pow(5);
    EXPECT_EQ(ft, root(ft5, 5));
    EXPECT_EQ(ft.inv(), root(ft5, -5));

    EXPECT_EQ(root(unit(-4.5, m), 2), error);
}